

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

bool icu_63::anon_unknown_0::equalBlocks(uint16_t *s,uint32_t *t,int32_t length)

{
  bool bVar1;
  int local_1c;
  uint32_t *puStack_18;
  int32_t length_local;
  uint32_t *t_local;
  uint16_t *s_local;
  
  local_1c = length;
  puStack_18 = t;
  t_local = (uint32_t *)s;
  while( true ) {
    bVar1 = false;
    if (0 < local_1c) {
      bVar1 = (uint)(ushort)*t_local == *puStack_18;
    }
    if (!bVar1) break;
    t_local = (uint32_t *)((long)t_local + 2);
    puStack_18 = puStack_18 + 1;
    local_1c = local_1c + -1;
  }
  return local_1c == 0;
}

Assistant:

inline bool
equalBlocks(const uint16_t *s, const uint32_t *t, int32_t length) {
    while (length > 0 && *s == *t) {
        ++s;
        ++t;
        --length;
    }
    return length == 0;
}